

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct64_stage11_avx2(__m256i *u,__m256i *out,int do_cols,int bd,int out_shift,__m256i *clamp_lo,
                        __m256i *clamp_hi)

{
  undefined1 auVar1 [16];
  __m256i in1;
  __m256i in0;
  int in_ECX;
  uint uVar2;
  int in_EDX;
  __m256i *in_RSI;
  __m256i *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  int i;
  int in_stack_fffffffffffffea4;
  __m256i *in_stack_fffffffffffffea8;
  undefined1 local_144;
  __m256i *in_stack_fffffffffffffed8;
  __m256i *in_stack_fffffffffffffee0;
  __m256i *in_stack_fffffffffffffee8;
  __m256i *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int iVar3;
  undefined4 uVar4;
  int size;
  undefined4 in_stack_ffffffffffffff18;
  
  uVar4 = (undefined4)in_R9;
  size = (int)((ulong)in_R9 >> 0x20);
  for (iVar3 = 0; iVar3 < 0x20; iVar3 = iVar3 + 1) {
    in0[0]._4_4_ = in_R8D;
    in0[0]._0_4_ = in_stack_ffffffffffffff18;
    in0[1]._0_4_ = in_ECX;
    in0[1]._4_4_ = in_EDX;
    in0[2] = (longlong)in_RSI;
    in0[3] = (longlong)in_RDI;
    in1[1] = in_stack_ffffffffffffff00;
    in1[0] = in_stack_fffffffffffffef8;
    in1[2]._0_4_ = in_stack_ffffffffffffff08;
    in1[2]._4_4_ = iVar3;
    in1[3]._0_4_ = uVar4;
    in1[3]._4_4_ = size;
    addsub_avx2(in0,in1,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  if (in_EDX == 0) {
    if (in_ECX + 6 < 0x10) {
      local_144 = '\x10';
    }
    else {
      local_144 = (char)in_ECX + '\x06';
    }
    uVar2 = -(1 << (local_144 - 1U & 0x1f));
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    uVar2 = (1 << (local_144 - 1U & 0x1f)) - 1;
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    round_shift_8x8_avx2(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    round_shift_8x8_avx2(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    round_shift_8x8_avx2(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    round_shift_8x8_avx2(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    highbd_clamp_epi32_avx2
              (in_RDI,in_RSI,(__m256i *)CONCAT44(in_EDX,in_ECX),
               (__m256i *)CONCAT44(in_R8D,in_stack_ffffffffffffff18),size);
  }
  return;
}

Assistant:

static inline void idct64_stage11_avx2(__m256i *output, __m256i *x) {
  btf_16_adds_subs_out_avx2(&output[0], &output[63], x[0], x[63]);
  btf_16_adds_subs_out_avx2(&output[1], &output[62], x[1], x[62]);
  btf_16_adds_subs_out_avx2(&output[2], &output[61], x[2], x[61]);
  btf_16_adds_subs_out_avx2(&output[3], &output[60], x[3], x[60]);
  btf_16_adds_subs_out_avx2(&output[4], &output[59], x[4], x[59]);
  btf_16_adds_subs_out_avx2(&output[5], &output[58], x[5], x[58]);
  btf_16_adds_subs_out_avx2(&output[6], &output[57], x[6], x[57]);
  btf_16_adds_subs_out_avx2(&output[7], &output[56], x[7], x[56]);
  btf_16_adds_subs_out_avx2(&output[8], &output[55], x[8], x[55]);
  btf_16_adds_subs_out_avx2(&output[9], &output[54], x[9], x[54]);
  btf_16_adds_subs_out_avx2(&output[10], &output[53], x[10], x[53]);
  btf_16_adds_subs_out_avx2(&output[11], &output[52], x[11], x[52]);
  btf_16_adds_subs_out_avx2(&output[12], &output[51], x[12], x[51]);
  btf_16_adds_subs_out_avx2(&output[13], &output[50], x[13], x[50]);
  btf_16_adds_subs_out_avx2(&output[14], &output[49], x[14], x[49]);
  btf_16_adds_subs_out_avx2(&output[15], &output[48], x[15], x[48]);
  btf_16_adds_subs_out_avx2(&output[16], &output[47], x[16], x[47]);
  btf_16_adds_subs_out_avx2(&output[17], &output[46], x[17], x[46]);
  btf_16_adds_subs_out_avx2(&output[18], &output[45], x[18], x[45]);
  btf_16_adds_subs_out_avx2(&output[19], &output[44], x[19], x[44]);
  btf_16_adds_subs_out_avx2(&output[20], &output[43], x[20], x[43]);
  btf_16_adds_subs_out_avx2(&output[21], &output[42], x[21], x[42]);
  btf_16_adds_subs_out_avx2(&output[22], &output[41], x[22], x[41]);
  btf_16_adds_subs_out_avx2(&output[23], &output[40], x[23], x[40]);
  btf_16_adds_subs_out_avx2(&output[24], &output[39], x[24], x[39]);
  btf_16_adds_subs_out_avx2(&output[25], &output[38], x[25], x[38]);
  btf_16_adds_subs_out_avx2(&output[26], &output[37], x[26], x[37]);
  btf_16_adds_subs_out_avx2(&output[27], &output[36], x[27], x[36]);
  btf_16_adds_subs_out_avx2(&output[28], &output[35], x[28], x[35]);
  btf_16_adds_subs_out_avx2(&output[29], &output[34], x[29], x[34]);
  btf_16_adds_subs_out_avx2(&output[30], &output[33], x[30], x[33]);
  btf_16_adds_subs_out_avx2(&output[31], &output[32], x[31], x[32]);
}